

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.h
# Opt level: O0

void * __thiscall
nodecpp::iibmalloc::IibAllocatorBase::allocateInCaseNoFreeBucket
          (IibAllocatorBase *this,size_t sz,uint8_t szidx)

{
  void *pvVar1;
  void *ret;
  MultipageData mpData;
  uintptr_t local_38;
  size_t bucketSz;
  size_t sStack_28;
  uint8_t szidx_local;
  size_t sz_local;
  IibAllocatorBase *this_local;
  size_t ret_1;
  
  ret_1 = (size_t)szidx;
  this_local = (IibAllocatorBase *)
               ((1L << ((szidx >> 1) + 3 & 0x3f)) +
               ((ret_1 + 1 & 1) - 1 & 1L << ((szidx >> 1) + 2 & 0x3f)));
  bucketSz._7_1_ = szidx;
  sStack_28 = sz;
  sz_local = (size_t)this;
  local_38 = alignUpExp((uintptr_t)this_local,3);
  mpData.sz2 = (size_t)&local_38;
  assert::
  nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::IibAllocatorBase::allocateInCaseNoFreeBucket(unsigned_long,unsigned_char)::_lambda()_1_>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
             ,0x439,(anon_class_8_1_885ba76f *)&mpData.sz2,"bucketSz >= sizeof( void* )");
  SoundingAddressPageAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_6UL,_23UL,_4UL,_3UL>::
  getMultipage(&this->pageAllocator,(ulong)bucketSz._7_1_,(MultipageData *)&ret);
  formatAllocatedPageAlignedBlock(this,(uint8_t *)ret,(size_t)mpData.ptr1,local_38,bucketSz._7_1_);
  formatAllocatedPageAlignedBlock
            (this,(uint8_t *)mpData.sz1,(size_t)mpData.ptr2,local_38,bucketSz._7_1_);
  pvVar1 = this->buckets[bucketSz._7_1_];
  this->buckets[bucketSz._7_1_] = *this->buckets[bucketSz._7_1_];
  return pvVar1;
}

Assistant:

NODECPP_NOINLINE void* allocateInCaseNoFreeBucket( size_t sz, uint8_t szidx )
	{
#ifdef USE_EXP_BUCKET_SIZES
		size_t bucketSz = indexToBucketSize( szidx );
#elif defined USE_HALF_EXP_BUCKET_SIZES
		size_t bucketSz = indexToBucketSizeHalfExp( szidx );
#elif defined USE_QUAD_EXP_BUCKET_SIZES
		size_t bucketSz = indexToBucketSizeQuarterExp( szidx );
#else
#error Undefined bucket size schema
#endif
		NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, bucketSz >= sizeof( void* ) );
		PageAllocatorT::MultipageData mpData;
//		uint8_t* block = reinterpret_cast<uint8_t*>( pageAllocator.getPage( szidx ) );
		pageAllocator.getMultipage( szidx, mpData );
		formatAllocatedPageAlignedBlock( reinterpret_cast<uint8_t*>( mpData.ptr1 ), mpData.sz1, bucketSz, szidx );
		formatAllocatedPageAlignedBlock( reinterpret_cast<uint8_t*>( mpData.ptr2 ), mpData.sz2, bucketSz, szidx );
		void* ret = buckets[szidx];
		buckets[szidx] = *reinterpret_cast<void**>(buckets[szidx]);
		return ret;
	}